

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O3

double EDCircles::computeEllipsePerimeter(EllipseEquation *eq)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  double dVar19;
  double dVar20;
  double local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  double local_a8;
  double dStack_70;
  double dStack_50;
  double dStack_20;
  
  auVar14 = *(undefined1 (*) [16])(eq->coeff + 1);
  dVar20 = eq->coeff[6];
  dVar6 = auVar14._0_8_;
  dVar10 = auVar14._8_8_ / dVar6;
  auVar13._8_8_ = dVar6;
  auVar13._0_8_ = eq->coeff[3];
  auVar1._8_4_ = auVar14._0_4_;
  auVar1._0_8_ = dVar6;
  auVar1._12_4_ = auVar14._4_4_;
  auVar18 = divpd(*(undefined1 (*) [16])(eq->coeff + 4),auVar1);
  auVar2._8_4_ = auVar14._0_4_;
  auVar2._0_8_ = dVar6;
  auVar2._12_4_ = auVar14._4_4_;
  auVar14 = divpd(auVar13,auVar2);
  if ((dVar10 != 0.0) || (NAN(dVar10))) {
    dVar15 = auVar14._8_8_;
    auVar7._8_4_ = auVar14._8_4_;
    auVar7._0_8_ = dVar15;
    auVar7._12_4_ = auVar14._12_4_;
    dVar11 = auVar14._0_8_;
    dVar16 = atan(dVar10 / (dVar15 - dVar11));
    local_d0 = dVar16 * 0.5;
    dVar16 = local_d0 + local_d0;
    dVar12 = cos(dVar16);
    dVar17 = sin(dVar16);
    dVar19 = cos(dVar16);
    sin(dVar16);
    cos(dVar16);
    dVar5 = cos(dVar16);
    auVar8._8_4_ = SUB84(dVar12 + 1.0,0);
    auVar8._0_8_ = 1.0 - dVar5;
    auVar8._12_4_ = (int)((ulong)(dVar12 + 1.0) >> 0x20);
    dVar12 = sin(dVar16);
    dVar16 = cos(dVar16);
    dStack_20 = auVar8._8_8_;
    local_c8._0_4_ = auVar14._0_4_;
    local_c8._4_4_ = auVar14._4_4_;
    uStack_c0._4_4_ = local_c8._4_4_;
    uStack_c0._0_4_ = (undefined4)local_c8;
    local_c8 = dVar11;
    dVar11 = dVar11 * (dVar16 + 1.0);
    uStack_c0 = uStack_c0 * (1.0 - dVar19);
    auVar9._8_4_ = SUB84(uStack_c0,0);
    auVar9._0_8_ = dVar11;
    auVar9._12_4_ = (int)((ulong)uStack_c0 >> 0x20);
    uStack_c0 = auVar9._8_8_;
    dVar11 = dVar11 + dVar12 * -dVar10 + (1.0 - dVar5);
    uStack_c0 = uStack_c0 + dVar17 * dVar10 + dStack_20;
    auVar3._8_4_ = SUB84(uStack_c0,0);
    auVar3._0_8_ = dVar11;
    auVar3._12_4_ = (int)((ulong)uStack_c0 >> 0x20);
    uStack_c0 = auVar3._8_8_;
    dStack_70 = auVar7._8_8_;
    dVar11 = dVar11 * dVar15;
    auVar4._8_4_ = SUB84(uStack_c0 * dStack_70,0);
    auVar4._0_8_ = dVar11;
    auVar4._12_4_ = (int)((ulong)(uStack_c0 * dStack_70) >> 0x20);
    uStack_c0 = auVar4._8_8_;
    auVar14._8_4_ = SUB84(uStack_c0 * 0.5,0);
    auVar14._0_8_ = dVar11 * 0.5;
    auVar14._12_4_ = (int)((ulong)(uStack_c0 * 0.5) >> 0x20);
    dVar16 = cos(local_d0);
    dVar12 = sin(local_d0);
    local_a8 = -auVar18._0_8_;
    dVar17 = sin(local_d0);
    dVar19 = cos(local_d0);
    dStack_50 = auVar18._8_8_;
    auVar18._0_8_ = dVar16 * auVar18._0_8_ + dVar12 * dStack_50;
    auVar18._8_8_ = dVar17 * local_a8 + dVar19 * dStack_50;
  }
  dVar16 = auVar14._8_8_;
  dVar12 = auVar14._0_8_;
  dVar19 = (auVar18._0_8_ / dVar16) * -0.5;
  dVar17 = (auVar18._8_8_ / dVar12) * -0.5;
  dVar20 = (dVar19 * dVar19 * dVar16 + dVar17 * dVar17 * dVar12) - dVar20 / dVar6;
  dVar16 = dVar20 / dVar16;
  if (dVar16 < 0.0) {
    dVar16 = sqrt(dVar16);
  }
  else {
    dVar16 = SQRT(dVar16);
  }
  dVar20 = dVar20 / dVar12;
  if (dVar20 < 0.0) {
    dVar20 = sqrt(dVar20);
  }
  else {
    dVar20 = SQRT(dVar20);
  }
  if ((dVar10 != 0.0) || (NAN(dVar10))) {
    cos(local_d0);
    sin(local_d0);
    sin(local_d0);
    cos(local_d0);
  }
  dVar10 = dVar16 + dVar20;
  dVar20 = ((dVar16 - dVar20) * (dVar16 - dVar20)) / (dVar10 * dVar10);
  dVar6 = dVar20 * -3.0 + 4.0;
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  return dVar10 * 3.14159265 * ((dVar20 * 3.0) / (dVar6 + 10.0) + 1.0);
}

Assistant:

double EDCircles::computeEllipsePerimeter(EllipseEquation * eq)
{
	double mult = 1;

	double A = eq->A()*mult;
	double B = eq->B()*mult;
	double C = eq->C()*mult;
	double D = eq->D()*mult;
	double E = eq->E()*mult;
	double F = eq->F()*mult;

	double A2, B2, C2, D2, E2, F2, theta;  //rotated coefficients
	double			   D3, E3, F3;             //ellipse form coefficients
	double cX, cY, a, b;		               //(cX,cY) center, a & b: semimajor & semiminor axes
	double h;							                 //h = (a-b)^2 / (a+b)^2
	bool rotation = false;

#define pi 3.14159265

	//Normalize coefficients
	B /= A; C /= A; D /= A; E /= A; F /= A; A /= A;

	if (B == 0) //Then not need to rotate the axes
	{
		A2 = A;
		B2 = B;
		C2 = C;
		D2 = D;
		E2 = E;
		F2 = F;

	}

	else if (B != 0) //Rotate the axes
	{
		rotation = true;

		//Determine the rotation angle (in radians)
		theta = atan(B / (A - C)) / 2;

		//Compute the coefficients wrt the new coordinate system 
		A2 = 0.5 * (A * (1 + cos(2 * theta) + B * sin(2 * theta) + C * (1 - cos(2 * theta))));

		B2 = (C - A) * sin(2 * theta) + B * cos(2 * theta); //B2 should turn to be zero?

		C2 = 0.5 * (A * (1 - cos(2 * theta) - B * sin(2 * theta) + C * (1 + cos(2 * theta))));

		D2 = D * cos(theta) + E * sin(theta);

		E2 = -D * sin(theta) + E * cos(theta);

		F2 = F;
	}

	//Transform the conic equation into the ellipse form
	D3 = D2 / A2; //normalize x term's coef 
				  //A3 = 1;     //A2 / A2

	E3 = E2 / C2; //normalize y term's coef
				  //C3 = 1;     //C2 / C2

	cX = -(D3 / 2);	//center X
	cY = -(E3 / 2);	//center Y

	F3 = A2 * pow(cX, 2.0) + C2 * pow(cY, 2.0) - F2;

	//semimajor axis
	a = sqrt(F3 / A2);
	//semiminor axis
	b = sqrt(F3 / C2);

	//Center coordinates have to be re-transformed if rotation is applied!
	if (rotation)
	{
		double tmpX = cX, tmpY = cY;
		cX = tmpX * cos(theta) - tmpY * sin(theta);
		cY = tmpX * sin(theta) + tmpY * cos(theta);
	}

	//Perimeter Computation(s)
	h = pow((a - b), 2.0) / pow((a + b), 2.0);

	//Ramajunan I
	//double P1 = pi * (a + b) * (3 - sqrt(4 - h));
	///printf("Perimeter of the ellipse is %.5f (Ramajunan I)\n", P1);

	//Ramajunan II
	double P2 = pi * (a + b) * (1 + 3 * h / (10 + sqrt(4 - 3 * h)));
	//	printf("Perimeter of the ellipse is %.5f (Ramajunan II)\n", P2);

	//  High-school formula
	//	double P3 = 2 * pi * sqrt(0.5 * (a*a + b*b));
	//	printf("Perimeter of the ellipse is %.5f (simple formula)\n", P3);

	return P2;
#undef pi
}